

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O1

int mcpl2ssw_parse_args(int argc,char **argv,char **inmcplfile,char **refsswfile,char **outsswfile,
                       long *nparticles_limit,long *surface_id)

{
  char cVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  char **ppcVar5;
  ulong uVar6;
  int unaff_EBP;
  long *plVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  int64_t opt_num_limit;
  long local_60;
  long local_58;
  char **local_50;
  char **local_48;
  long *local_40;
  char **local_38;
  
  *inmcplfile = (char *)0x0;
  *refsswfile = (char *)0x0;
  *outsswfile = (char *)0x0;
  *nparticles_limit = 0x7fffffff;
  *surface_id = 0;
  local_58 = -1;
  local_60 = -1;
  local_50 = refsswfile;
  local_48 = inmcplfile;
  local_40 = nparticles_limit;
  if (1 < argc) {
    uVar9 = 1;
    local_38 = outsswfile;
    do {
      pcVar8 = argv[uVar9];
      sVar4 = strlen(pcVar8);
      if (sVar4 == 0) {
        bVar10 = false;
      }
      else if (sVar4 == 1) {
LAB_00104a40:
        if ((*pcVar8 == '-') || (*outsswfile != (char *)0x0)) {
          printf("ERROR: %s\n\n");
          puts("Run with -h or --help for usage information");
          unaff_EBP = 1;
          bVar10 = true;
        }
        else {
          if (*local_50 == (char *)0x0) {
            ppcVar5 = local_48;
            if (*local_48 != (char *)0x0) {
              ppcVar5 = local_50;
            }
            *ppcVar5 = pcVar8;
          }
          else {
            *outsswfile = pcVar8;
          }
          bVar10 = false;
        }
      }
      else if ((*pcVar8 == '-') && (pcVar8[1] != '-')) {
        bVar10 = 1 < sVar4;
        outsswfile = local_38;
        if (bVar10) {
          plVar7 = (long *)0x0;
          uVar6 = 2;
          do {
            cVar1 = pcVar8[uVar6 - 1];
            if (plVar7 == (long *)0x0) {
              plVar7 = &local_58;
              if (cVar1 != 'l') {
                if (cVar1 != 's') {
                  if (cVar1 != 'h') goto LAB_00104bc5;
                  mcpl2ssw_app_usage(argv,(char *)0x0);
                  unaff_EBP = -1;
                  outsswfile = local_38;
                  break;
                }
                plVar7 = &local_60;
              }
              *plVar7 = 0;
              if (uVar6 == sVar4) goto LAB_00104bc5;
            }
            else {
              if ((byte)(cVar1 - 0x3aU) < 0xf6) {
LAB_00104bc5:
                printf("ERROR: %s\n\n");
                puts("Run with -h or --help for usage information");
                unaff_EBP = 1;
                outsswfile = local_38;
                break;
              }
              lVar2 = *plVar7;
              *plVar7 = lVar2 * 10;
              *plVar7 = lVar2 * 10 + (long)pcVar8[uVar6 - 1] + -0x30;
            }
            bVar10 = uVar6 < sVar4;
            bVar11 = uVar6 != sVar4;
            uVar6 = uVar6 + 1;
            outsswfile = local_38;
          } while (bVar11);
        }
      }
      else {
        if ((sVar4 != 6) || (iVar3 = strcmp(pcVar8,"--help"), iVar3 != 0)) goto LAB_00104a40;
        mcpl2ssw_app_usage(argv,(char *)0x0);
        bVar10 = true;
        unaff_EBP = -1;
      }
      if (bVar10) {
        return unaff_EBP;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)argc);
  }
  if (*local_48 == (char *)0x0) {
    pcVar8 = "Missing argument : input MCPL file";
  }
  else if (*local_50 == (char *)0x0) {
    pcVar8 = "Missing argument : Reference SSW file";
  }
  else {
    if (*outsswfile == (char *)0x0) {
      *outsswfile = "output.ssw";
    }
    if (local_58 < 1) {
      local_58 = 0x7fffffff;
    }
    if (local_58 < 0x80000000) {
      *local_40 = local_58;
      if (local_60 != 0 && local_60 < 1000000) {
        if (local_60 < 0) {
          local_60 = 0;
        }
        *surface_id = local_60;
        return 0;
      }
      pcVar8 = "Parameter out of range : Surface ID must be in range [1,999999].";
    }
    else {
      pcVar8 = "Parameter out of range : SSW files can only hold up to 2147483647 particles.";
    }
  }
  printf("ERROR: %s\n\n",pcVar8);
  puts("Run with -h or --help for usage information");
  return 1;
}

Assistant:

int mcpl2ssw_parse_args(int argc,const char **argv, const char** inmcplfile,
                        const char **refsswfile, const char **outsswfile,
                        long* nparticles_limit, long* surface_id) {
  //returns: 0 all ok, 1: error, -1: all ok but do nothing (-h/--help mode)
  *inmcplfile = 0;
  *refsswfile = 0;
  *outsswfile = 0;
  *nparticles_limit = INT32_MAX;
  *surface_id = 0;

  int64_t opt_num_limit = -1;
  int64_t opt_num_isurf = -1;
  int i;
  for (i = 1; i<argc; ++i) {
    const char * a = argv[i];
    size_t n = strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = 0;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9')
            return mcpl2ssw_app_usage(argv,"Bad option: expected number");
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        switch(a[j]) {
        case 'h': mcpl2ssw_app_usage(argv,0); return -1;
        case 'l': consume_digit = &opt_num_limit; break;
        case 's': consume_digit = &opt_num_isurf; break;
        default:
          return mcpl2ssw_app_usage(argv,"Unrecognised option");
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n)
            return mcpl2ssw_app_usage(argv,"Bad option: missing number");
        }
      }

    } else if (n==6 && strcmp(a,"--help")==0) {
      mcpl2ssw_app_usage(argv,0);
      return -1;
    } else if (n>=1&&a[0]!='-') {
      if (*outsswfile)
        return mcpl2ssw_app_usage(argv,"Too many arguments.");
      if (*refsswfile) *outsswfile = a;
      else if (*inmcplfile) *refsswfile = a;
      else *inmcplfile = a;
    } else {
      return mcpl2ssw_app_usage(argv,"Bad arguments");
    }
  }

  if (!*inmcplfile)
    return mcpl2ssw_app_usage(argv,"Missing argument : input MCPL file");
  if (!*refsswfile)
    return mcpl2ssw_app_usage(argv,"Missing argument : Reference SSW file");
  if (!*outsswfile)
    *outsswfile = "output.ssw";

  if (opt_num_limit<=0)
    opt_num_limit = INT32_MAX;
  if (opt_num_limit>INT32_MAX)
    return mcpl2ssw_app_usage(argv,"Parameter out of range : SSW files can only hold up to 2147483647 particles.");
  *nparticles_limit = (long)opt_num_limit;

  if (opt_num_isurf==0||opt_num_isurf>999999)
    return mcpl2ssw_app_usage(argv,"Parameter out of range : Surface ID must be in range [1,999999].");
  if (opt_num_isurf<0)
    opt_num_isurf = 0;

  *surface_id = (long)opt_num_isurf;

  return 0;
}